

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZGenGrid2D.cpp
# Opt level: O3

bool __thiscall
TPZGenGrid2D::ReadAndMergeGeoMesh
          (TPZGenGrid2D *this,TPZGeoMesh *gridinitial,TPZGeoMesh *tomerge,int matid)

{
  double dVar1;
  bool bVar2;
  TPZGeoEl *pTVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  TPZGeoNode *pTVar8;
  TPZGeoNode *pTVar9;
  TPZGeoEl **ppTVar10;
  long lVar11;
  long lVar12;
  undefined4 extraout_var;
  int p_1;
  int iVar13;
  ulong uVar14;
  int p;
  int iVar15;
  int64_t nelem;
  TPZAdmChunkVector<TPZGeoNode,_10> *this_00;
  long lVar16;
  int64_t iVar17;
  TPZVec<long> nos;
  TPZVec<double> coordtomerge;
  TPZVec<double> coordinitial;
  int64_t index;
  TPZGeoMesh gtomerge;
  TPZVec<long> local_358;
  TPZVec<double> local_338;
  int64_t local_318;
  TPZGenGrid2D *local_310;
  int64_t local_308;
  TPZVec<double> local_300;
  undefined1 local_2e0 [8];
  TPZGeoMesh local_2d8;
  
  local_310 = this;
  iVar4 = (*this->_vptr_TPZGenGrid2D[2])(this,gridinitial,(ulong)(uint)matid);
  if (((short)iVar4 == 0) &&
     (((tomerge->fNodeVec).super_TPZChunkVector<TPZGeoNode,_10>.fNElements != 0 ||
      ((tomerge->fElementVec).super_TPZChunkVector<TPZGeoEl_*,_10>.fNElements != 0)))) {
    TPZGeoMesh::TPZGeoMesh(&local_2d8,tomerge);
    iVar17 = (gridinitial->fNodeVec).super_TPZChunkVector<TPZGeoNode,_10>.fNElements;
    local_338._vptr_TPZVec = (_func_int **)0x0;
    TPZVec<double>::TPZVec(&local_300,3,(double *)&local_338);
    local_358._vptr_TPZVec = (_func_int **)0x0;
    TPZVec<double>::TPZVec(&local_338,3,(double *)&local_358);
    if (0 < local_2d8.fNodeVec.super_TPZChunkVector<TPZGeoNode,_10>.fNElements) {
      this_00 = &gridinitial->fNodeVec;
      nelem = 0;
      local_318 = iVar17;
      do {
        pTVar8 = TPZChunkVector<TPZGeoNode,_10>::operator[]
                           (&local_2d8.fNodeVec.super_TPZChunkVector<TPZGeoNode,_10>,nelem);
        TPZGeoNode::GetCoordinates(pTVar8,&local_338);
        lVar16 = 0;
        if (iVar17 < 1) {
LAB_0142a62e:
          if (lVar16 == iVar17) goto LAB_0142a637;
        }
        else {
          do {
            pTVar9 = TPZChunkVector<TPZGeoNode,_10>::operator[]
                               (&this_00->super_TPZChunkVector<TPZGeoNode,_10>,lVar16);
            TPZGeoNode::GetCoordinates(pTVar9,&local_300);
            if (ABS(SQRT((local_338.fStore[2] - local_300.fStore[2]) *
                         (local_338.fStore[2] - local_300.fStore[2]) +
                         (*local_338.fStore - *local_300.fStore) *
                         (*local_338.fStore - *local_300.fStore) +
                         (local_338.fStore[1] - local_300.fStore[1]) *
                         (local_338.fStore[1] - local_300.fStore[1]))) < 1e-12) {
              TPZGeoNode::SetCoord(pTVar8,0,(double)pTVar8->fId);
              pTVar9 = TPZChunkVector<TPZGeoNode,_10>::operator[]
                                 (&this_00->super_TPZChunkVector<TPZGeoNode,_10>,lVar16);
              pTVar8->fId = pTVar9->fId;
              goto LAB_0142a62e;
            }
            lVar16 = lVar16 + 1;
          } while (iVar17 != lVar16);
LAB_0142a637:
          local_308 = nelem;
          iVar5 = TPZAdmChunkVector<TPZGeoNode,_10>::AllocateNewElement(this_00);
          pTVar9 = TPZChunkVector<TPZGeoNode,_10>::operator[]
                             (&this_00->super_TPZChunkVector<TPZGeoNode,_10>,(long)iVar5);
          TPZGeoNode::Initialize(pTVar9,&local_338,gridinitial);
          pTVar9 = TPZChunkVector<TPZGeoNode,_10>::operator[]
                             (&this_00->super_TPZChunkVector<TPZGeoNode,_10>,(long)iVar5);
          if (0 < local_2d8.fElementVec.super_TPZChunkVector<TPZGeoEl_*,_10>.fNElements) {
            iVar5 = pTVar9->fId;
            iVar13 = pTVar8->fId;
            lVar16 = 0;
            do {
              ppTVar10 = TPZChunkVector<TPZGeoEl_*,_10>::operator[]
                                   (&local_2d8.fElementVec.super_TPZChunkVector<TPZGeoEl_*,_10>,
                                    lVar16);
              pTVar3 = *ppTVar10;
              if (pTVar3 != (TPZGeoEl *)0x0) {
                for (iVar15 = 0; iVar6 = (**(code **)(*(long *)pTVar3 + 0x90))(pTVar3),
                    iVar15 < iVar6; iVar15 = iVar15 + 1) {
                  lVar11 = (**(code **)(*(long *)pTVar3 + 0xa8))(pTVar3,iVar15);
                  if (lVar11 == iVar13) {
                    (**(code **)(*(long *)pTVar3 + 0x178))(pTVar3,iVar15,(long)iVar5);
                  }
                }
              }
              lVar16 = lVar16 + 1;
            } while (lVar16 < local_2d8.fElementVec.super_TPZChunkVector<TPZGeoEl_*,_10>.fNElements)
            ;
          }
          pTVar8->fId = -1;
          nelem = local_308;
          iVar17 = local_318;
        }
        nelem = nelem + 1;
      } while (nelem != local_2d8.fNodeVec.super_TPZChunkVector<TPZGeoNode,_10>.fNElements);
      if (0 < local_2d8.fNodeVec.super_TPZChunkVector<TPZGeoNode,_10>.fNElements) {
        lVar16 = 0;
        do {
          pTVar8 = TPZChunkVector<TPZGeoNode,_10>::operator[]
                             (&local_2d8.fNodeVec.super_TPZChunkVector<TPZGeoNode,_10>,lVar16);
          iVar5 = pTVar8->fId;
          if (((long)iVar5 != -1) &&
             (0 < local_2d8.fElementVec.super_TPZChunkVector<TPZGeoEl_*,_10>.fNElements)) {
            dVar1 = pTVar8->fCoord[0];
            lVar11 = 0;
            do {
              ppTVar10 = TPZChunkVector<TPZGeoEl_*,_10>::operator[]
                                   (&local_2d8.fElementVec.super_TPZChunkVector<TPZGeoEl_*,_10>,
                                    lVar11);
              pTVar3 = *ppTVar10;
              if (pTVar3 != (TPZGeoEl *)0x0) {
                for (iVar13 = 0; iVar15 = (**(code **)(*(long *)pTVar3 + 0x90))(pTVar3),
                    iVar13 < iVar15; iVar13 = iVar13 + 1) {
                  lVar12 = (**(code **)(*(long *)pTVar3 + 0xa8))(pTVar3,iVar13);
                  if (lVar12 == (long)dVar1) {
                    (**(code **)(*(long *)pTVar3 + 0x178))(pTVar3,iVar13,(long)iVar5);
                  }
                }
              }
              lVar11 = lVar11 + 1;
            } while (lVar11 < local_2d8.fElementVec.super_TPZChunkVector<TPZGeoEl_*,_10>.fNElements)
            ;
          }
          lVar16 = lVar16 + 1;
        } while (lVar16 != local_2d8.fNodeVec.super_TPZChunkVector<TPZGeoNode,_10>.fNElements);
      }
    }
    if (0 < local_2d8.fElementVec.super_TPZChunkVector<TPZGeoEl_*,_10>.fNElements) {
      lVar16 = 0;
      do {
        ppTVar10 = TPZChunkVector<TPZGeoEl_*,_10>::operator[]
                             (&local_2d8.fElementVec.super_TPZChunkVector<TPZGeoEl_*,_10>,lVar16);
        pTVar3 = *ppTVar10;
        if (pTVar3 != (TPZGeoEl *)0x0) {
          local_358._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813f30;
          local_358.fStore = (long *)0x0;
          local_358.fNElements = 0;
          local_358.fNAlloc = 0;
          iVar5 = (**(code **)(*(long *)pTVar3 + 0x90))(pTVar3);
          iVar13 = (**(code **)(*(long *)pTVar3 + 0x90))(pTVar3);
          TPZVec<long>::Resize(&local_358,(long)iVar13);
          if (0 < iVar5) {
            uVar14 = 0;
            do {
              lVar11 = (**(code **)(*(long *)pTVar3 + 0xa8))(pTVar3,uVar14 & 0xffffffff);
              local_358.fStore[uVar14] = lVar11;
              uVar14 = uVar14 + 1;
            } while ((long)iVar5 != uVar14);
          }
          bVar2 = local_310->fRefPattern;
          uVar7 = (**(code **)(*(long *)pTVar3 + 0xb8))(pTVar3);
          iVar5 = (*(gridinitial->super_TPZSavable)._vptr_TPZSavable[0xc])
                            (gridinitial,(ulong)uVar7,&local_358,(ulong)(uint)pTVar3->fMatId,
                             local_2e0,(ulong)bVar2);
          if (CONCAT44(extraout_var,iVar5) == 0) {
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZGenGrid2D.cpp"
                       ,0x111);
          }
          local_358._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813f30;
          if (local_358.fStore != (long *)0x0) {
            operator_delete__(local_358.fStore);
          }
        }
        lVar16 = lVar16 + 1;
      } while (lVar16 != local_2d8.fElementVec.super_TPZChunkVector<TPZGeoEl_*,_10>.fNElements);
    }
    TPZGeoMesh::ResetConnectivities(gridinitial);
    TPZGeoMesh::BuildConnectivity(gridinitial);
    local_338._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
    if (local_338.fStore != (double *)0x0) {
      operator_delete__(local_338.fStore);
    }
    local_300._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
    if (local_300.fStore != (double *)0x0) {
      operator_delete__(local_300.fStore);
    }
    TPZGeoMesh::~TPZGeoMesh(&local_2d8);
  }
  return (short)iVar4 == 0;
}

Assistant:

bool TPZGenGrid2D::ReadAndMergeGeoMesh(TPZGeoMesh* gridinitial, TPZGeoMesh* tomerge, int matid) {
    // gridinitial is created by TPZGenGrid2D current
    if (Read(gridinitial, matid))
        return false;
    if (!tomerge->NNodes() && !tomerge->NElements())
        return true;

    // Copy vectors for nodes and elements of the gridtomerge, then the original data is preserved
    TPZGeoMesh gtomerge(*tomerge);
    TPZGeoMesh *gridtomerge = &gtomerge;

    int64_t i, j, k, nnodestomerge = gridtomerge->NNodes();
    int64_t nnodesinitial = gridinitial->NNodes();
    //    int nneltomerge = gridtomerge->NElements();
    TPZVec<REAL> coordinitial(3, 0.);
    TPZVec<REAL> coordtomerge(3, 0.);
    TPZGeoNode *nodetomerge;
    TPZGeoEl *gel;
    // Verifing each node in gridtomerge if exist into the gridinitial (as same coordinates). It is inefficient.
    for (i = 0; i < nnodestomerge; i++) {
        nodetomerge = &(gridtomerge->NodeVec()[i]);
        if (!nodetomerge) continue;
        nodetomerge->GetCoordinates(coordtomerge);
        for (j = 0; j < nnodesinitial; j++) {
            gridinitial->NodeVec()[j].GetCoordinates(coordinitial);
            if (IsZero(Distance(coordtomerge, coordinitial))) {
                // In this case exists a node with same coordinates, then the id is update as id of the gridinitial with same coordinates
                // and the old id is stored in coord[0]
                nodetomerge->SetCoord(0, nodetomerge->Id());
                nodetomerge->SetNodeId(gridinitial->NodeVec()[j].Id());
                break;
            }
        }

        // If the node (i) not exists into the gridinitial is created a new node copy in this grid, and is substitutived in all the 
        // elements in gridinitial the id as old node with the id of the new node. At last the id of the node duplicated is put as -1
        if (j == nnodesinitial) {
            // resizing the vector of the nodes
            int64_t index = gridinitial->NodeVec().AllocateNewElement();
            gridinitial->NodeVec()[index].Initialize(coordtomerge, *gridinitial);
            index = gridinitial->NodeVec()[index].Id();
            int64_t oldid = nodetomerge->Id();
            for (k = 0; k < gridtomerge->NElements(); k++) {
                gel = gridtomerge->ElementVec()[k];
                if (!gel) continue;
                for (int p = 0; p < gel->NNodes(); p++)
                    if (gel->NodeIndex(p) == oldid)
                        gel->SetNodeIndex(p, index);
            }
            nodetomerge->SetNodeId(-1);
        }
    }

    // changing the id of the repeated nodes into the geometric elements of the gridtomerge
    for (i = 0; i < nnodestomerge; i++) {
        nodetomerge = &(gridtomerge->NodeVec()[i]);
        if (!nodetomerge || nodetomerge->Id() == -1) continue;
        int64_t idnew = nodetomerge->Id(), idold = (int64_t) (nodetomerge->Coord(0));
        for (k = 0; k < gridtomerge->NElements(); k++) {
            gel = gridtomerge->ElementVec()[k];
            if (!gel) continue;
            for (int p = 0; p < gel->NNodes(); p++)
                if (gel->NodeIndex(p) == idold)
                    gel->SetNodeIndex(p, idnew);
        }
    }

    // creating new element into gridinitial corresponding for each element in gridtomerge
    int64_t nelmerge = gridtomerge->NElements();
    for (i = 0; i < nelmerge; i++) {
        gel = gridtomerge->ElementVec()[i];
        if (!gel) continue;
        TPZVec<int64_t> nos;
        int64_t ngelnodes = gel->NNodes(), index;
        nos.Resize(gel->NNodes());
        for (j = 0; j < ngelnodes; j++)
            nos[j] = gel->NodeIndex(j);
        int eltype = 1;
        if (fRefPattern == false) {
            eltype = 0;
        }

        if (!gridinitial->CreateGeoElement(gel->Type(), nos, gel->MaterialId(), index, eltype))
            DebugStop();
    }

    // computing the connectivity
    gridinitial->ResetConnectivities();
    gridinitial->BuildConnectivity();
    return true;
}